

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupport_c_expectOneMemBufferParameterAndValueFailsDueToContents_Test::testBody
          (TEST_MockSupport_c_expectOneMemBufferParameterAndValueFailsDueToContents_Test *this)

{
  SimpleString local_60 [2];
  undefined1 local_40 [8];
  TestTestingFixture fixture;
  TEST_MockSupport_c_expectOneMemBufferParameterAndValueFailsDueToContents_Test *this_local;
  
  fixture.result_ = (TestResult *)this;
  TestTestingFixture::TestTestingFixture((TestTestingFixture *)local_40);
  TestTestingFixture::setTestFunction
            ((TestTestingFixture *)local_40,failingCallToMockCWithMemoryBuffer_);
  TestTestingFixture::runAllTests((TestTestingFixture *)local_40);
  SimpleString::SimpleString
            (local_60,
             "Unexpected parameter value to parameter \"name\" to function \"bar\": <Size = 3 | HexContents = 12 05 FF>"
            );
  TestTestingFixture::assertPrintContains((TestTestingFixture *)local_40,local_60);
  SimpleString::~SimpleString(local_60);
  TestTestingFixture::~TestTestingFixture((TestTestingFixture *)local_40);
  return;
}

Assistant:

TEST(MockSupport_c, expectOneMemBufferParameterAndValueFailsDueToContents)
{
    TestTestingFixture fixture;
    fixture.setTestFunction(failingCallToMockCWithMemoryBuffer_);
    fixture.runAllTests();
    fixture.assertPrintContains("Unexpected parameter value to parameter \"name\" "
                                "to function \"bar\": <Size = 3 | HexContents = 12 05 FF>");
}